

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode.h
# Opt level: O0

string * __thiscall sfc::mode_abi_cxx11_(string *__return_storage_ptr__,sfc *this,Mode mode)

{
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d;
  allocator<char> local_2c;
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  undefined4 local_14;
  string *psStack_10;
  Mode mode_local;
  
  local_14 = SUB84(this,0);
  psStack_10 = __return_storage_ptr__;
  switch(local_14) {
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"snes",&local_15);
    std::allocator<char>::~allocator(&local_15);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"snes_mode7",local_25);
    std::allocator<char>::~allocator(local_25);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"gb",&local_26);
    std::allocator<char>::~allocator(&local_26);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"gbc",&local_27);
    std::allocator<char>::~allocator(&local_27);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"gba",&local_28);
    std::allocator<char>::~allocator(&local_28);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"gba_affine",&local_29);
    std::allocator<char>::~allocator(&local_29);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"md",&local_2a);
    std::allocator<char>::~allocator(&local_2a);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"pce",&local_2b);
    std::allocator<char>::~allocator(&local_2b);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"pce_sprite",&local_2c);
    std::allocator<char>::~allocator(&local_2c);
    break;
  case 10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ws",&local_2d);
    std::allocator<char>::~allocator(&local_2d);
    break;
  case 0xb:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"wsc",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    break;
  case 0xc:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"wsc_packed",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
    break;
  case 0xd:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ngp",&local_30);
    std::allocator<char>::~allocator(&local_30);
    break;
  case 0xe:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ngpc",&local_31);
    std::allocator<char>::~allocator(&local_31);
    break;
  case 0xf:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"sms",&local_32);
    std::allocator<char>::~allocator(&local_32);
    break;
  case 0x10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"gg",&local_33);
    std::allocator<char>::~allocator(&local_33);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"none",&local_34);
    std::allocator<char>::~allocator(&local_34);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string mode(Mode mode) {
  switch (mode) {
  case Mode::snes:
    return std::string("snes");
  case Mode::snes_mode7:
    return std::string("snes_mode7");
  case Mode::gb:
    return std::string("gb");
  case Mode::gbc:
    return std::string("gbc");
  case Mode::gba:
    return std::string("gba");
  case Mode::gba_affine:
    return std::string("gba_affine");
  case Mode::md:
    return std::string("md");
  case Mode::pce:
    return std::string("pce");
  case Mode::pce_sprite:
    return std::string("pce_sprite");
  case Mode::ws:
    return std::string("ws");
  case Mode::wsc:
    return std::string("wsc");
  case Mode::wsc_packed:
    return std::string("wsc_packed");
  case Mode::ngp:
    return std::string("ngp");
  case Mode::ngpc:
    return std::string("ngpc");
  case Mode::sms:
    return std::string("sms");
  case Mode::gg:
    return std::string("gg");
  default:
    return std::string("none");
  }
}